

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void ParseHTMLWithNode(TidyDocImpl *doc,Node *node)

{
  TidyParserMemory *pTVar1;
  Parser *pPVar2;
  long lVar3;
  GetTokenMode mode;
  bool bVar4;
  
  pPVar2 = GetParserForNode(doc,node);
  mode = IgnoreWhitespace;
LAB_00138a38:
  bVar4 = false;
LAB_00138a3a:
  if (bVar4) {
    return;
  }
  if (pPVar2 != (Parser *)0x0) {
    node = (*pPVar2)(doc,node,mode);
    if (node != (Node *)0x0) goto LAB_00138abf;
  }
  lVar3 = (long)(doc->stack).top;
  if (-1 < lVar3) goto code_r0x00138a66;
  goto LAB_00138a95;
LAB_00138abf:
  pPVar2 = GetParserForNode(doc,node);
  goto LAB_00138a38;
code_r0x00138a66:
  pTVar1 = (doc->stack).content;
  pPVar2 = pTVar1[lVar3].identity;
  node = (Node *)0x0;
  bVar4 = false;
  if (pPVar2 == (Parser *)0x0) {
    mode = pTVar1[lVar3].mode;
    prvTidypopMemory(doc);
    pPVar2 = (Parser *)0x0;
LAB_00138a95:
    node = prvTidyGetToken(doc,mode);
    bVar4 = node == (Node *)0x0;
    if (!bVar4) {
      pPVar2 = GetParserForNode(doc,node);
    }
  }
  goto LAB_00138a3a;
}

Assistant:

void ParseHTMLWithNode( TidyDocImpl* doc, Node* node )
{
    GetTokenMode mode = IgnoreWhitespace;
    Parser* parser = GetParserForNode( doc, node );
    Bool something_to_do = yes;

    /*
     This main loop is only extinguished when all of the parser tokens are
     consumed. Ideally, EVERY parser will return nodes to this loop for
     dispatch to the appropriate parser, but some of the recursive parsers
     still consume some tokens on their own.
     */
    while (something_to_do)
    {
        node = parser ? parser( doc, node, mode ) : NULL;
        
        /*
         We have a node, so anything deferred was already pushed to the stack
         to be dealt with later.
         */
        if ( node )
        {
            parser = GetParserForNode( doc, node );
            continue;
        }

        /*
         We weren't given a node, which means this particular leaf is bottomed
         out. We'll re-enter the parsers using information from the stack.
         */
        if ( !TY_(isEmptyParserStack)(doc))
        {
            parser = TY_(peekMemoryIdentity)(doc);
            if (parser)
            {
                continue;
            }
            else
            {
                /* No parser means we're only passing back a parsing mode. */
                mode = TY_(peekMemoryMode)( doc );
                TY_(popMemory)( doc );
            }
        }
        
        /*
         At this point, there's nothing being returned from parsers, and
         nothing on the stack, so we can draw a new node from the lexer.
         */
        node = TY_(GetToken)( doc, mode );
        DEBUG_LOG_GOT_TOKEN(node);

        if (node)
            parser = GetParserForNode( doc, node );
        else
            something_to_do = no;
    }
}